

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFArgParser.cc
# Opt level: O2

string * __thiscall
QPDFArgParser::getProgname_abi_cxx11_(string *__return_storage_ptr__,QPDFArgParser *this)

{
  std::__cxx11::string::string
            ((string *)__return_storage_ptr__,
             (string *)
             &((this->m).super___shared_ptr<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr)->whoami);
  return __return_storage_ptr__;
}

Assistant:

std::string
QPDFArgParser::getProgname()
{
    return m->whoami;
}